

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pfdata.cpp
# Opt level: O0

int __thiscall
PFData::fileReadSubgridAtGridIndexInternal
          (PFData *this,double *buffer,FILE *fp,int gridZ,int gridY,int gridX)

{
  int iVar1;
  int iVar2;
  int iVar3;
  long lVar4;
  size_t __n;
  size_t sVar5;
  int *piVar6;
  uint64_t uVar7;
  FILE *in_RDX;
  void *in_RSI;
  uint64_t tmp;
  size_t i;
  size_t numRead;
  longlong count;
  longlong offset;
  undefined8 in_stack_ffffffffffffffa8;
  PFData *in_stack_ffffffffffffffb0;
  ulong uVar8;
  undefined8 in_stack_ffffffffffffffb8;
  PFData *in_stack_ffffffffffffffc0;
  undefined4 local_4;
  
  lVar4 = getSubgridOffset(in_stack_ffffffffffffffc0,(int)((ulong)in_stack_ffffffffffffffb8 >> 0x20)
                           ,(int)in_stack_ffffffffffffffb8,
                           (int)((ulong)in_stack_ffffffffffffffb0 >> 0x20));
  fseek(in_RDX,lVar4 + 0x24,0);
  iVar3 = (int)((ulong)in_stack_ffffffffffffffa8 >> 0x20);
  iVar1 = getSubgridSizeX(in_stack_ffffffffffffffb0,iVar3);
  iVar2 = getSubgridSizeY(in_stack_ffffffffffffffb0,iVar3);
  iVar3 = getSubgridSizeZ(in_stack_ffffffffffffffb0,iVar3);
  __n = (size_t)(iVar1 * iVar2 * iVar3);
  sVar5 = fread(in_RSI,8,__n,in_RDX);
  if (sVar5 == __n) {
    for (uVar8 = 0; uVar8 < __n; uVar8 = uVar8 + 1) {
      uVar7 = bswap64(*(uint64_t *)((long)in_RSI + uVar8 * 8));
      *(uint64_t *)((long)in_RSI + uVar8 * 8) = uVar7;
    }
    local_4 = 0;
  }
  else {
    piVar6 = __errno_location();
    local_4 = *piVar6;
  }
  return local_4;
}

Assistant:

int PFData::fileReadSubgridAtGridIndexInternal(double* buffer, std::FILE* fp, int gridZ, int gridY, int gridX) const{
    const long long offset = getSubgridOffset(gridZ, gridY, gridX) + 36; //Skip header
    std::fseek(fp, offset, SEEK_SET);

    static_assert(sizeof(double) == 8, "Double must be 8 bytes");

    //Number of elements to read
    const long long count = getSubgridSizeX(gridZ) * getSubgridSizeY(gridY) * getSubgridSizeZ(gridX);

    std::size_t numRead = std::fread(buffer, 8, count, fp);
    if(numRead != static_cast<std::size_t>(count)){
        return errno;
    }

    //Perform endian conversion
    for(std::size_t i = 0; i < count; ++i){
        uint64_t tmp = *reinterpret_cast<uint64_t*>(&buffer[i]);
        tmp = bswap64(tmp);
        buffer[i] = *reinterpret_cast<double*>(&tmp);
    }

    return 0;
}